

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_EmptyBuilder::_Run(_Test_EmptyBuilder *this)

{
  bool bVar1;
  Slice *value;
  Slice block;
  FilterBlockReader reader;
  FilterBlockBuilder builder;
  Slice local_290;
  FilterBlockReader local_280;
  Slice local_258;
  FilterBlockBuilder local_248;
  Tester local_1b8;
  
  FilterBlockBuilder::FilterBlockBuilder(&local_248,(FilterPolicy *)this);
  local_290 = FilterBlockBuilder::Finish(&local_248);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/filter_block_test.cc"
  ;
  local_1b8.line_ = 0x2f;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  EscapeString_abi_cxx11_((string *)&local_280,(leveldb *)&local_290,value);
  test::Tester::IsEq<char[21],std::__cxx11::string>
            (&local_1b8,(char (*) [21])"\\x00\\x00\\x00\\x00\\x0b",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280);
  if (local_280.policy_ != (FilterPolicy *)&local_280.offset_) {
    operator_delete(local_280.policy_);
  }
  test::Tester::~Tester(&local_1b8);
  FilterBlockReader::FilterBlockReader(&local_280,(FilterPolicy *)this,&local_290);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/filter_block_test.cc"
  ;
  local_1b8.line_ = 0x31;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  local_258.data_ = "foo";
  local_258.size_ = 3;
  bVar1 = FilterBlockReader::KeyMayMatch(&local_280,0,&local_258);
  test::Tester::Is(&local_1b8,bVar1,"reader.KeyMayMatch(0, \"foo\")");
  test::Tester::~Tester(&local_1b8);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/filter_block_test.cc"
  ;
  local_1b8.line_ = 0x32;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  local_258.data_ = "foo";
  local_258.size_ = 3;
  bVar1 = FilterBlockReader::KeyMayMatch(&local_280,100000,&local_258);
  test::Tester::Is(&local_1b8,bVar1,"reader.KeyMayMatch(100000, \"foo\")");
  test::Tester::~Tester(&local_1b8);
  if (local_248.filter_offsets_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.filter_offsets_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_248.tmp_keys_.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.tmp_keys_.
                    super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.result_._M_dataplus._M_p != &local_248.result_.field_2) {
    operator_delete(local_248.result_._M_dataplus._M_p);
  }
  if (local_248.start_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.start_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.keys_._M_dataplus._M_p != &local_248.keys_.field_2) {
    operator_delete(local_248.keys_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(FilterBlockTest, EmptyBuilder) {
  FilterBlockBuilder builder(&policy_);
  Slice block = builder.Finish();
  ASSERT_EQ("\\x00\\x00\\x00\\x00\\x0b", EscapeString(block));
  FilterBlockReader reader(&policy_, block);
  ASSERT_TRUE(reader.KeyMayMatch(0, "foo"));
  ASSERT_TRUE(reader.KeyMayMatch(100000, "foo"));
}